

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O3

void __thiscall cppcms::session_pool::session_pool(session_pool *this,value *v)

{
  _data *p_Var1;
  cached_settings *this_00;
  
  p_Var1 = (_data *)operator_new(0x18);
  *(undefined8 *)p_Var1 = 0;
  (p_Var1->settings).d.d.ptr_ = (_data *)0x0;
  (p_Var1->cached_settings).ptr_ = (cached_settings *)0x0;
  booster::shared_object::shared_object((shared_object *)p_Var1);
  json::value::copyable::copyable(&(p_Var1->settings).d);
  (p_Var1->cached_settings).ptr_ = (cached_settings *)0x0;
  (this->d).ptr_ = p_Var1;
  (this->backend_)._M_t.
  super___uniq_ptr_impl<cppcms::session_api_factory,_std::default_delete<cppcms::session_api_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::session_api_factory_*,_std::default_delete<cppcms::session_api_factory>_>
  .super__Head_base<0UL,_cppcms::session_api_factory_*,_false>._M_head_impl =
       (session_api_factory *)0x0;
  (this->encryptor_)._M_t.
  super___uniq_ptr_impl<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::sessions::encryptor_factory_*,_std::default_delete<cppcms::sessions::encryptor_factory>_>
  .super__Head_base<0UL,_cppcms::sessions::encryptor_factory_*,_false>._M_head_impl =
       (encryptor_factory *)0x0;
  (this->storage_)._M_t.
  super___uniq_ptr_impl<cppcms::sessions::session_storage_factory,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::sessions::session_storage_factory_*,_std::default_delete<cppcms::sessions::session_storage_factory>_>
  .super__Head_base<0UL,_cppcms::sessions::session_storage_factory_*,_false>._M_head_impl =
       (session_storage_factory *)0x0;
  this->service_ = (service *)0x0;
  json::value::copyable::operator=(&(p_Var1->settings).d,&v->d);
  p_Var1 = (this->d).ptr_;
  this_00 = (cached_settings *)operator_new(0x180);
  impl::cached_settings::cached_settings(this_00,v);
  booster::hold_ptr<cppcms::impl::cached_settings>::reset(&p_Var1->cached_settings,this_00);
  return;
}

Assistant:

session_pool::session_pool(cppcms::json::value const &v) :
	d(new _data()),
	service_(0)
{
	d->settings = v;
	d->cached_settings.reset(new cppcms::impl::cached_settings(v));
}